

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool sum_binary(_Bool *a,_Bool *b,size_t length,_Bool *result)

{
  byte local_3f;
  byte local_3e;
  _Bool local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  ulong uStack_38;
  _Bool a_xor_b;
  size_t n;
  _Bool carry;
  _Bool *result_local;
  size_t length_local;
  _Bool *b_local;
  _Bool *a_local;
  
  n._7_1_ = false;
  for (uStack_38 = 0; uStack_38 < length; uStack_38 = uStack_38 + 1) {
    if (((a[uStack_38] & 1U) != 0) || (local_3a = 0, (b[uStack_38] & 1U) != 0)) {
      local_3b = 0;
      if ((a[uStack_38] & 1U) != 0) {
        local_3b = b[uStack_38];
      }
      local_3a = local_3b ^ 0xff;
    }
    local_3a = local_3a & 1;
    if ((local_3a != 0) || (local_3c = 0, n._7_1_ != false)) {
      local_3d = false;
      if (local_3a != 0) {
        local_3d = n._7_1_;
      }
      local_3c = local_3d ^ 0xff;
    }
    result[uStack_38] = (_Bool)(local_3c & 1);
    if ((local_3a == 0) || (local_3e = 1, n._7_1_ == false)) {
      local_3f = 0;
      if ((a[uStack_38] & 1U) != 0) {
        local_3f = b[uStack_38];
      }
      local_3e = local_3f;
    }
    n._7_1_ = (_Bool)(local_3e & 1);
  }
  return n._7_1_;
}

Assistant:

bool sum_binary(const bool* a, const bool* b, const size_t length, bool* result) {
  bool carry = false;
  for (size_t n = 0; n < length; n++) {
    bool a_xor_b = (a[n] || b[n]) && !(a[n] && b[n]); // a ^ b
    result[n] = (a_xor_b || carry) && !(a_xor_b && carry); // (a ^ b) ^ carry
    carry = (a_xor_b && carry) || (a[n] && b[n]); // (a ^ b) ^ carry | a & b
  }
  return carry;
}